

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
update_simplex_tree_before_node_removal
          (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this,Simplex_handle *sh)

{
  node_ptr plVar1;
  reference ppVar2;
  reference ppVar3;
  node_ptr plVar4;
  node_ptr next;
  
  _to_node_it((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)&stack0xffffffffffffffe0,
              (Simplex_handle *)this);
  ppVar2 = boost::container::dtl::
           iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
           ::operator*((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                        *)&stack0xffffffffffffffe0);
  plVar1 = (ppVar2->second).super_Hooks_simplex_base.list_max_vertex_hook_.super_type.super_type.
           next_;
  if (plVar1 != (node_ptr)0x0) {
    plVar4 = (ppVar2->second).super_Hooks_simplex_base.list_max_vertex_hook_.super_type.super_type.
             prev_;
    plVar4->next_ = plVar1;
    plVar1->prev_ = plVar4;
    (ppVar2->second).super_Hooks_simplex_base.list_max_vertex_hook_.super_type.super_type.next_ =
         (node_ptr)0x0;
    (ppVar2->second).super_Hooks_simplex_base.list_max_vertex_hook_.super_type.super_type.prev_ =
         (node_ptr)0x0;
  }
  ppVar3 = boost::container::dtl::
           iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
           ::operator*(sh);
  plVar4 = (node_ptr)
           std::__detail::
           _Map_base<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&ppVar3->first);
  plVar1 = (((type *)&plVar4->next_)->data_).root_plus_size_.m_header.super_node.next_;
  if (plVar1 == (node_ptr)0x0 || plVar1 == plVar4) {
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
             ::operator*(sh);
    std::
    _Hashtable<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,ppVar3);
  }
  return;
}

Assistant:

void update_simplex_tree_before_node_removal(Simplex_handle sh) {
#ifdef DEBUG_TRACES
    std::clog << "update_simplex_tree_before_node_removal" << std::endl;
#endif  // DEBUG_TRACES
    if constexpr (Options::link_nodes_by_label) {
      _to_node_it(sh)->second.unlink_hooks();  // remove from lists of same label Nodes
      if (nodes_label_to_list_[sh->first].empty())
        nodes_label_to_list_.erase(sh->first);
    }
  }